

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PointerGraph.h
# Opt level: O0

void __thiscall dg::pta::PointerGraph::PointerGraph(PointerGraph *this)

{
  undefined4 *in_RDI;
  void **in_stack_ffffffffffffffd8;
  vector<std::unique_ptr<dg::pta::PSNode,_std::default_delete<dg::pta::PSNode>_>,_std::allocator<std::unique_ptr<dg::pta::PSNode,_std::default_delete<dg::pta::PSNode>_>_>_>
  *in_stack_ffffffffffffffe0;
  vector<std::unique_ptr<dg::pta::PSNode,_std::default_delete<dg::pta::PSNode>_>,_std::allocator<std::unique_ptr<dg::pta::PSNode,_std::default_delete<dg::pta::PSNode>_>_>_>
  *this_00;
  
  *in_RDI = 0;
  *(undefined8 *)(in_RDI + 2) = 0;
  std::
  vector<std::unique_ptr<dg::pta::PSNode,_std::default_delete<dg::pta::PSNode>_>,_std::allocator<std::unique_ptr<dg::pta::PSNode,_std::default_delete<dg::pta::PSNode>_>_>_>
  ::vector((vector<std::unique_ptr<dg::pta::PSNode,_std::default_delete<dg::pta::PSNode>_>,_std::allocator<std::unique_ptr<dg::pta::PSNode,_std::default_delete<dg::pta::PSNode>_>_>_>
            *)0x16a05a);
  std::
  vector<std::unique_ptr<dg::pta::PointerSubgraph,_std::default_delete<dg::pta::PointerSubgraph>_>,_std::allocator<std::unique_ptr<dg::pta::PointerSubgraph,_std::default_delete<dg::pta::PointerSubgraph>_>_>_>
  ::vector((vector<std::unique_ptr<dg::pta::PointerSubgraph,_std::default_delete<dg::pta::PointerSubgraph>_>,_std::allocator<std::unique_ptr<dg::pta::PointerSubgraph,_std::default_delete<dg::pta::PointerSubgraph>_>_>_>
            *)0x16a068);
  in_RDI[0x10] = 3;
  GenericCallGraph<dg::pta::PSNode_*>::GenericCallGraph
            ((GenericCallGraph<dg::pta::PSNode_*> *)0x16a07d);
  std::vector<dg::pta::PSNode_*,_std::allocator<dg::pta::PSNode_*>_>::vector
            ((vector<dg::pta::PSNode_*,_std::allocator<dg::pta::PSNode_*>_> *)0x16a08e);
  std::
  vector<std::unique_ptr<dg::pta::PSNode,std::default_delete<dg::pta::PSNode>>,std::allocator<std::unique_ptr<dg::pta::PSNode,std::default_delete<dg::pta::PSNode>>>>
  ::emplace_back<decltype(nullptr)>(in_stack_ffffffffffffffe0,in_stack_ffffffffffffffd8);
  std::
  vector<std::unique_ptr<dg::pta::PSNode,std::default_delete<dg::pta::PSNode>>,std::allocator<std::unique_ptr<dg::pta::PSNode,std::default_delete<dg::pta::PSNode>>>>
  ::emplace_back<decltype(nullptr)>(in_stack_ffffffffffffffe0,in_stack_ffffffffffffffd8);
  this_00 = (vector<std::unique_ptr<dg::pta::PSNode,_std::default_delete<dg::pta::PSNode>_>,_std::allocator<std::unique_ptr<dg::pta::PSNode,_std::default_delete<dg::pta::PSNode>_>_>_>
             *)0x0;
  std::
  vector<std::unique_ptr<dg::pta::PSNode,std::default_delete<dg::pta::PSNode>>,std::allocator<std::unique_ptr<dg::pta::PSNode,std::default_delete<dg::pta::PSNode>>>>
  ::emplace_back<decltype(nullptr)>
            ((vector<std::unique_ptr<dg::pta::PSNode,_std::default_delete<dg::pta::PSNode>_>,_std::allocator<std::unique_ptr<dg::pta::PSNode,_std::default_delete<dg::pta::PSNode>_>_>_>
              *)0x0,in_stack_ffffffffffffffd8);
  std::
  vector<std::unique_ptr<dg::pta::PSNode,std::default_delete<dg::pta::PSNode>>,std::allocator<std::unique_ptr<dg::pta::PSNode,std::default_delete<dg::pta::PSNode>>>>
  ::emplace_back<decltype(nullptr)>(this_00,(void **)0x0);
  dg::pta::PointerGraph::initStaticNodes();
  return;
}

Assistant:

PointerGraph() {
        // nodes[0] represents invalid node (the node with id 0)
        nodes.emplace_back(nullptr);
        // the first several nodes are special nodes. For now, we just replace
        // them with nullptr, as those are created statically <-- FIXME!
        nodes.emplace_back(nullptr);
        nodes.emplace_back(nullptr);
        nodes.emplace_back(nullptr);
        assert(nodes.size() - 1 == PointerGraphReservedIDs::LAST_RESERVED_ID);
        initStaticNodes();
    }